

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::countFunctionCall
          (ZEbasic_leakChecker *this,string *functionName)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_true>
  local_48;
  iterator it;
  string *functionName_local;
  ZEbasic_leakChecker *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_true>
               )functionName;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
       ::find(&this->counts,functionName);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
       ::end(&this->counts);
  bVar1 = std::__detail::operator==(&local_48,&local_50);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_false,_true>
                           *)&local_48);
    LOCK();
    (ppVar2->second).super___atomic_base<long>._M_i =
         (ppVar2->second).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void basic_leakChecker::ZEbasic_leakChecker::countFunctionCall(const std::string &functionName)
    {
        auto it = counts.find(functionName);

        // make sure there is no insertion happening during program exeuction
        // as inserting to the map is not thread safe
        if (it == counts.end()) {
            return;
        }

        it->second.fetch_add(1, std::memory_order_relaxed);
    }